

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUISkin::draw3DToolBar(CGUISkin *this,IGUIElement *element,rect<int> *r,rect<int> *clip)

{
  EGUI_SKIN_TYPE EVar1;
  IVideoDriver *pIVar2;
  uint uVar3;
  uint uVar4;
  SColor c1;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  pIVar2 = this->Driver;
  if (pIVar2 != (IVideoDriver *)0x0) {
    local_48 = (r->UpperLeftCorner).X;
    iStack_3c = (r->LowerRightCorner).Y;
    iStack_44 = iStack_3c + -1;
    iStack_40 = (r->LowerRightCorner).X;
    uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
    (*pIVar2->_vptr_IVideoDriver[0x33])(pIVar2,(ulong)uVar3,&local_48,clip);
    local_48 = (r->UpperLeftCorner).X;
    iStack_44 = (r->UpperLeftCorner).Y;
    iStack_40 = (r->LowerRightCorner).X;
    iStack_3c = (r->LowerRightCorner).Y + -1;
    if (this->UseGradient == false) {
      pIVar2 = this->Driver;
      uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
      (*pIVar2->_vptr_IVideoDriver[0x33])(pIVar2,(ulong)uVar3,&local_48,clip);
    }
    else {
      EVar1 = this->Type;
      uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
      if (EVar1 == EGST_BURNING_SKIN) {
        uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
        iStack_3c = iStack_3c + 1;
        (*this->Driver->_vptr_IVideoDriver[0x34])
                  (this->Driver,&local_48,(ulong)(uVar3 | 0xf0000000),(ulong)(uVar4 | 0xf0000000),
                   (ulong)(uVar3 | 0xf0000000),(ulong)(uVar4 | 0xf0000000),clip);
      }
      else {
        uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
        (*this->Driver->_vptr_IVideoDriver[0x34])
                  (this->Driver,&local_48,(ulong)uVar3,(ulong)uVar3,(ulong)uVar4,(ulong)uVar4,clip);
      }
    }
  }
  return;
}

Assistant:

void CGUISkin::draw3DToolBar(IGUIElement *element,
		const core::rect<s32> &r,
		const core::rect<s32> *clip)
{
	if (!Driver)
		return;

	core::rect<s32> rect = r;

	rect.UpperLeftCorner.X = r.UpperLeftCorner.X;
	rect.UpperLeftCorner.Y = r.LowerRightCorner.Y - 1;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);

	rect = r;
	rect.LowerRightCorner.Y -= 1;

	if (!UseGradient) {
		Driver->draw2DRectangle(getColor(EGDC_3D_FACE), rect, clip);
	} else if (Type == EGST_BURNING_SKIN) {
		const video::SColor c1 = 0xF0000000 | getColor(EGDC_3D_FACE).color;
		const video::SColor c2 = 0xF0000000 | getColor(EGDC_3D_SHADOW).color;

		rect.LowerRightCorner.Y += 1;
		Driver->draw2DRectangle(rect, c1, c2, c1, c2, clip);
	} else {
		const video::SColor c1 = getColor(EGDC_3D_FACE);
		const video::SColor c2 = getColor(EGDC_3D_SHADOW);
		Driver->draw2DRectangle(rect, c1, c1, c2, c2, clip);
	}
}